

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

Aig_Man_t * Rtm_ManToAig(Rtm_Man_t *pRtm)

{
  int *pLatches;
  void *pvVar1;
  Aig_Man_t *p;
  undefined8 *puVar2;
  Aig_Obj_t *pAVar3;
  Rtm_Obj_t *pObjRtm;
  ulong uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  Vec_Ptr_t *p_00;
  int iVar11;
  int iVar12;
  ulong uVar13;
  
  p_00 = pRtm->vObjs;
  uVar10 = (ulong)p_00->nSize;
  pLatches = (int *)malloc(uVar10 << 3);
  iVar8 = 0;
  for (iVar12 = 0; iVar12 < (int)uVar10; iVar12 = iVar12 + 1) {
    pvVar1 = Vec_PtrEntry(p_00,iVar12);
    uVar5 = *(uint *)((long)pvVar1 + 8);
    puVar6 = (uint *)((long)pvVar1 + 0x20);
    for (uVar10 = 0; (uVar5 >> 7 & 0xff) != uVar10; uVar10 = uVar10 + 1) {
      pLatches[uVar10 + (long)*(int *)((long)pvVar1 + 0xc) * 2] = pRtm->vPis->nSize + iVar8;
      iVar8 = iVar8 + (*puVar6 & 0xfff);
      puVar6 = puVar6 + 4;
    }
    p_00 = pRtm->vObjs;
    uVar10 = (ulong)(uint)p_00->nSize;
  }
  p = Aig_ManStart((int)uVar10 + iVar8);
  puVar2 = (undefined8 *)Vec_PtrEntry(pRtm->vObjs,0);
  *puVar2 = p->pConst1;
  for (iVar12 = 0; iVar12 < pRtm->vPis->nSize; iVar12 = iVar12 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(pRtm->vPis,iVar12);
    pAVar3 = Aig_ObjCreateCi(p);
    *puVar2 = pAVar3;
  }
  iVar12 = 0;
  if (0 < iVar8) {
    iVar12 = iVar8;
  }
  while (iVar12 != 0) {
    Aig_ObjCreateCi(p);
    iVar12 = iVar12 + -1;
  }
  for (iVar12 = 0; iVar12 < pRtm->vObjs->nSize; iVar12 = iVar12 + 1) {
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vObjs,iVar12);
    Rtm_ManToAig_rec(p,pRtm,pObjRtm,pLatches);
  }
  for (iVar12 = 0; iVar12 < pRtm->vPos->nSize; iVar12 = iVar12 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(pRtm->vPos,iVar12);
    Aig_ObjCreateCo(p,(Aig_Obj_t *)*puVar2);
  }
  iVar12 = 0;
  do {
    if (pRtm->vObjs->nSize <= iVar12) {
      free(pLatches);
      Aig_ManSetRegNum(p,iVar8);
      Aig_ManCleanup(p);
      iVar8 = Aig_ManCheck(p);
      if (iVar8 == 0) {
        puts("Rtm_ManToAig: The network check has failed.");
      }
      return p;
    }
    pvVar1 = Vec_PtrEntry(pRtm->vObjs,iVar12);
    for (uVar10 = 0; uVar10 < (*(uint *)((long)pvVar1 + 8) >> 7 & 0xff); uVar10 = uVar10 + 1) {
      uVar5 = *(uint *)((long)pvVar1 + uVar10 * 0x10 + 0x20);
      if ((uVar5 & 0xfff) != 0) {
        uVar4 = **(ulong **)((long)pvVar1 + uVar10 * 0x10 + 0x18);
        iVar11 = -1;
        for (uVar7 = 0; uVar9 = uVar5 & 0xfff, uVar7 < uVar9; uVar7 = uVar7 + 1) {
          uVar5 = uVar5 >> 0xc;
          if (10 < uVar9) {
            uVar5 = pRtm->pExtra[(ulong)uVar5 + (long)((int)(iVar11 + uVar9) >> 4)];
          }
          uVar5 = uVar5 >> ((char)(iVar11 + uVar9) * '\x02' & 0x1fU) & 3;
          if (2 < uVar5 - 1) {
            __assert_fail("Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                          ,0x326,"Aig_Man_t *Rtm_ManToAig(Rtm_Man_t *)");
          }
          uVar13 = (ulong)(uVar5 == 2);
          Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar4 ^ uVar13));
          pAVar3 = Aig_ManCi(p,pLatches[(long)(int)uVar10 + (long)*(int *)((long)pvVar1 + 0xc) * 2]
                               + uVar7);
          uVar4 = (ulong)pAVar3 ^ uVar13;
          uVar5 = *(uint *)((long)pvVar1 + uVar10 * 0x10 + 0x20);
          iVar11 = iVar11 + -1;
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Rtm_ManToAig( Rtm_Man_t * pRtm )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObjNew;
    Rtm_Obj_t * pObjRtm;
    Rtm_Edg_t * pEdge;
    int i, k, m, Val, nLatches, * pLatches;
    // count latches and mark the first latch on each edge
    pLatches = ABC_ALLOC( int, 2 * Vec_PtrSize(pRtm->vObjs) );
    nLatches = 0;
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        pLatches[2*pObjRtm->Id + k] = Vec_PtrSize(pRtm->vPis) + nLatches;
        nLatches += pEdge->nLats;
    }
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(pRtm->vObjs) + nLatches );
    // create PIs/POs and latches
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->pCopy = Aig_ManConst1(pNew);
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->pCopy = Aig_ObjCreateCi(pNew);
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCi(pNew);
    // create internal nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
        Rtm_ManToAig_rec( pNew, pRtm, pObjRtm, pLatches );
    // create POs
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObjRtm->pCopy );
    // connect latches 
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            continue;
        pObjNew = (Aig_Obj_t *)Rtm_ObjFanin( pObjRtm, k )->pCopy;
        for ( m = 0; m < (int)pEdge->nLats; m++ )
        {
            Val = Rtm_ObjGetOne( pRtm, pEdge, pEdge->nLats - 1 - m );
            assert( Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
            Aig_ObjCreateCo( pNew, pObjNew );
            pObjNew = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + m );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
        }
//        assert( Aig_Regular(pObjNew)->nRefs > 0 );
    }
    ABC_FREE( pLatches );
    Aig_ManSetRegNum( pNew, nLatches );
    // remove useless nodes
    Aig_ManCleanup( pNew );
    if ( !Aig_ManCheck( pNew ) )
        printf( "Rtm_ManToAig: The network check has failed.\n" );
    return pNew;
}